

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

void cw_get_writefunc(Curl_easy *data,cw_out_type otype,curl_write_callback *pwcb,void **pwcb_data,
                     size_t *pmax_write,size_t *pmin_write)

{
  curl_write_callback local_50;
  curl_write_callback local_48;
  size_t *pmin_write_local;
  size_t *pmax_write_local;
  void **pwcb_data_local;
  curl_write_callback *pwcb_local;
  cw_out_type otype_local;
  Curl_easy *data_local;
  
  if (otype == CW_OUT_BODY) {
    *pwcb = (data->set).fwrite_func;
    *pwcb_data = (data->set).out;
    *pmax_write = 0x4000;
    *pmin_write = 0;
  }
  else if (otype == CW_OUT_HDS) {
    if ((data->set).fwrite_header == (curl_write_callback)0x0) {
      if ((data->set).writeheader == (void *)0x0) {
        local_50 = (curl_write_callback)0x0;
      }
      else {
        local_50 = (data->set).fwrite_func;
      }
      local_48 = local_50;
    }
    else {
      local_48 = (data->set).fwrite_header;
    }
    *pwcb = local_48;
    *pwcb_data = (data->set).writeheader;
    *pmax_write = 0;
    *pmin_write = 0;
  }
  else {
    *pwcb = (curl_write_callback)0x0;
    *pwcb_data = (void *)0x0;
    *pmax_write = 0x4000;
    *pmin_write = 0;
  }
  return;
}

Assistant:

static void cw_get_writefunc(struct Curl_easy *data, cw_out_type otype,
                             curl_write_callback *pwcb, void **pwcb_data,
                             size_t *pmax_write, size_t *pmin_write)
{
  switch(otype) {
  case CW_OUT_BODY:
    *pwcb = data->set.fwrite_func;
    *pwcb_data = data->set.out;
    *pmax_write = CURL_MAX_WRITE_SIZE;
    /* if we ever want buffering of BODY output, we can set `min_write`
     * the preferred size. The default should always be to pass data
     * to the client as it comes without delay */
    *pmin_write = 0;
    break;
  case CW_OUT_HDS:
    *pwcb = data->set.fwrite_header ? data->set.fwrite_header :
             (data->set.writeheader ? data->set.fwrite_func : NULL);
    *pwcb_data = data->set.writeheader;
    *pmax_write = 0; /* do not chunk-write headers, write them as they are */
    *pmin_write = 0;
    break;
  default:
    *pwcb = NULL;
    *pwcb_data = NULL;
    *pmax_write = CURL_MAX_WRITE_SIZE;
    *pmin_write = 0;
  }
}